

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this)

{
  int iVar1;
  bool bVar2;
  token_type tVar3;
  char *pcVar4;
  size_t length;
  
  if (((this->position).chars_read_total != 0) || (bVar2 = skip_bom(this), bVar2)) {
switchD_001a3b85_caseD_20:
    while( true ) {
      get(this);
      iVar1 = this->current;
      if (0x1f < iVar1) break;
      if (1 < iVar1 - 9U) {
        if (iVar1 + 1U < 2) {
          return end_of_input;
        }
        if (iVar1 != 0xd) goto switchD_001a3b85_caseD_21;
      }
    }
    if (0x5a < iVar1) {
      if (iVar1 < 0x6e) {
        if (iVar1 == 0x5b) {
          return begin_array;
        }
        if (iVar1 == 0x5d) {
          return end_array;
        }
        if (iVar1 != 0x66) goto switchD_001a3b85_caseD_21;
        pcVar4 = "false";
        length = 5;
        tVar3 = literal_false;
      }
      else {
        if (0x7a < iVar1) {
          if (iVar1 == 0x7b) {
            return begin_object;
          }
          if (iVar1 == 0x7d) {
            return end_object;
          }
          goto switchD_001a3b85_caseD_21;
        }
        if (iVar1 == 0x6e) {
          pcVar4 = "null";
          length = 4;
          tVar3 = literal_null;
        }
        else {
          if (iVar1 != 0x74) goto switchD_001a3b85_caseD_21;
          pcVar4 = "true";
          length = 4;
          tVar3 = literal_true;
        }
      }
      tVar3 = scan_literal(this,pcVar4,length,tVar3);
      return tVar3;
    }
    switch(iVar1) {
    case 0x20:
      goto switchD_001a3b85_caseD_20;
    default:
      goto switchD_001a3b85_caseD_21;
    case 0x22:
      tVar3 = scan_string(this);
      return tVar3;
    case 0x2c:
      return value_separator;
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      tVar3 = scan_number(this);
      return tVar3;
    case 0x3a:
      return name_separator;
    }
  }
  pcVar4 = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
LAB_001a3bf0:
  this->error_message = pcVar4;
  return parse_error;
switchD_001a3b85_caseD_21:
  pcVar4 = "invalid literal";
  goto LAB_001a3bf0;
}

Assistant:

token_type scan() {
		// initially, skip the BOM
		if (position.chars_read_total == 0 and not skip_bom()) {
			error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
			return token_type::parse_error;
		}

		// read next character and ignore whitespace
		do {
			get();
		} while (current == ' ' or current == '\t' or current == '\n' or current == '\r');

		switch (current) {
			// structural characters
			case '[':
				return token_type::begin_array;
			case ']':
				return token_type::end_array;
			case '{':
				return token_type::begin_object;
			case '}':
				return token_type::end_object;
			case ':':
				return token_type::name_separator;
			case ',':
				return token_type::value_separator;

			// literals
			case 't':
				return scan_literal("true", 4, token_type::literal_true);
			case 'f':
				return scan_literal("false", 5, token_type::literal_false);
			case 'n':
				return scan_literal("null", 4, token_type::literal_null);

			// string
			case '\"':
				return scan_string();

			// number
			case '-':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				return scan_number();

			// end of input (the null byte is needed when parsing from
			// string literals)
			case '\0':
			case std::char_traits<char>::eof():
				return token_type::end_of_input;

			// error
			default:
				error_message = "invalid literal";
				return token_type::parse_error;
		}
	}